

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvDiurnal_kry.c
# Opt level: O0

int jtv(N_Vector v,N_Vector Jv,sunrealtype t,N_Vector u,N_Vector fu,void *user_data,N_Vector tmp)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 in_RDI;
  long in_R8;
  double in_XMM0_Qa;
  double dVar22;
  double dVar23;
  double dVar24;
  UserData data;
  sunrealtype *Jvdata;
  sunrealtype *vdata;
  sunrealtype *udata;
  int iright;
  int ileft;
  int iup;
  int idn;
  int jy;
  int jx;
  sunrealtype horaco;
  sunrealtype hordco;
  sunrealtype verdco;
  sunrealtype dely;
  sunrealtype q4coef;
  sunrealtype yup;
  sunrealtype ydn;
  sunrealtype s;
  sunrealtype cyup;
  sunrealtype cydn;
  sunrealtype Jv2;
  sunrealtype Jv1;
  sunrealtype v2rt;
  sunrealtype v1rt;
  sunrealtype v2lt;
  sunrealtype v1lt;
  sunrealtype v2up;
  sunrealtype v1up;
  sunrealtype v2dn;
  sunrealtype v1dn;
  sunrealtype v2;
  sunrealtype v1;
  sunrealtype c2;
  sunrealtype c1;
  undefined4 local_100;
  undefined4 local_fc;
  
  lVar19 = N_VGetArrayPointer(in_RDX);
  lVar20 = N_VGetArrayPointer(in_RDI);
  lVar21 = N_VGetArrayPointer(in_RSI);
  dVar22 = sin(*(double *)(in_R8 + 0x968) * in_XMM0_Qa);
  if (dVar22 <= 0.0) {
    *(undefined8 *)(in_R8 + 0x960) = 0;
  }
  else {
    dVar22 = exp(-7.601 / dVar22);
    *(double *)(in_R8 + 0x960) = dVar22;
  }
  dVar22 = *(double *)(in_R8 + 0x960);
  dVar1 = *(double *)(in_R8 + 0x978);
  dVar2 = *(double *)(in_R8 + 0x990);
  dVar3 = *(double *)(in_R8 + 0x980);
  dVar4 = *(double *)(in_R8 + 0x988);
  for (local_100 = 0; local_100 < 10; local_100 = local_100 + 1) {
    dVar23 = ((double)local_100 - 0.5) * dVar1 + 30.0;
    dVar24 = exp(dVar23 * 0.2);
    dVar24 = dVar2 * dVar24;
    dVar23 = exp((dVar23 + dVar1) * 0.2);
    dVar23 = dVar2 * dVar23;
    iVar15 = -1;
    if (local_100 == 0) {
      iVar15 = 1;
    }
    iVar16 = 1;
    if (local_100 == 9) {
      iVar16 = -1;
    }
    for (local_fc = 0; local_fc < 10; local_fc = local_fc + 1) {
      dVar5 = *(double *)(lVar19 + (long)(local_fc * 2 + local_100 * 0x14) * 8);
      dVar6 = *(double *)(lVar19 + (long)(local_fc * 2 + 1 + local_100 * 0x14) * 8);
      dVar7 = *(double *)(lVar20 + (long)(local_fc * 2 + local_100 * 0x14) * 8);
      dVar8 = *(double *)(lVar20 + (long)(local_fc * 2 + 1 + local_100 * 0x14) * 8);
      dVar9 = *(double *)(lVar20 + (long)(local_fc * 2 + 1 + (local_100 + iVar15) * 0x14) * 8);
      dVar10 = *(double *)(lVar20 + (long)(local_fc * 2 + 1 + (local_100 + iVar16) * 0x14) * 8);
      iVar17 = -1;
      if (local_fc == 0) {
        iVar17 = 1;
      }
      iVar18 = 1;
      if (local_fc == 9) {
        iVar18 = -1;
      }
      dVar11 = *(double *)(lVar20 + (long)((local_fc + iVar17) * 2 + local_100 * 0x14) * 8);
      dVar12 = *(double *)(lVar20 + (long)((local_fc + iVar17) * 2 + 1 + local_100 * 0x14) * 8);
      dVar13 = *(double *)(lVar20 + (long)((local_fc + iVar18) * 2 + local_100 * 0x14) * 8);
      dVar14 = *(double *)(lVar20 + (long)((local_fc + iVar18) * 2 + 1 + local_100 * 0x14) * 8);
      *(double *)(lVar21 + (long)(local_fc * 2 + local_100 * 0x14) * 8) =
           dVar4 * (dVar13 - dVar11) +
           dVar3 * ((dVar13 - (dVar7 + dVar7)) + dVar11) +
           dVar24 * *(double *)(lVar20 + (long)(local_fc * 2 + (local_100 + iVar15) * 0x14) * 8) +
           -(dVar23 + dVar24) * dVar7 +
           dVar23 * *(double *)(lVar20 + (long)(local_fc * 2 + (local_100 + iVar16) * 0x14) * 8) +
           -(dVar6 * 4.66e-16 + 6.031000000000001) * dVar7 + (dVar5 * -4.66e-16 + dVar22) * dVar8 +
           0.0;
      *(double *)(lVar21 + (long)(local_fc * 2 + 1 + local_100 * 0x14) * 8) =
           dVar4 * (dVar14 - dVar12) +
           dVar3 * ((dVar14 - (dVar8 + dVar8)) + dVar12) +
           dVar24 * dVar9 + -(dVar23 + dVar24) * dVar8 + dVar23 * dVar10 +
           (dVar6 * -4.66e-16 + 6.031000000000001) * dVar7 + -((dVar5 * 4.66e-16 + dVar22) * dVar8)
           + 0.0;
    }
  }
  return 0;
}

Assistant:

static int jtv(N_Vector v, N_Vector Jv, sunrealtype t, N_Vector u, N_Vector fu,
               void* user_data, N_Vector tmp)
{
  sunrealtype c1, c2;
  sunrealtype v1, v2, v1dn, v2dn, v1up, v2up, v1lt, v2lt, v1rt, v2rt;
  sunrealtype Jv1, Jv2;
  sunrealtype cydn, cyup;
  sunrealtype s, ydn, yup;
  sunrealtype q4coef, dely, verdco, hordco, horaco;
  int jx, jy, idn, iup, ileft, iright;
  sunrealtype *udata, *vdata, *Jvdata;
  UserData data;

  data = (UserData)user_data;

  udata  = N_VGetArrayPointer(u);
  vdata  = N_VGetArrayPointer(v);
  Jvdata = N_VGetArrayPointer(Jv);

  /* Set diurnal rate coefficients. */

  s = sin(data->om * t);
  if (s > ZERO) { data->q4 = exp(-A4 / s); }
  else { data->q4 = ZERO; }

  /* Make local copies of problem variables, for efficiency. */

  q4coef = data->q4;
  dely   = data->dy;
  verdco = data->vdco;
  hordco = data->hdco;
  horaco = data->haco;

  /* Loop over all grid points. */

  for (jy = 0; jy < MY; jy++)
  {
    /* Set vertical diffusion coefficients at jy +- 1/2 */

    ydn = YMIN + (jy - SUN_RCONST(0.5)) * dely;
    yup = ydn + dely;

    cydn = verdco * exp(SUN_RCONST(0.2) * ydn);
    cyup = verdco * exp(SUN_RCONST(0.2) * yup);

    idn = (jy == 0) ? 1 : -1;
    iup = (jy == MY - 1) ? -1 : 1;

    for (jx = 0; jx < MX; jx++)
    {
      Jv1 = ZERO;
      Jv2 = ZERO;

      /* Extract c1 and c2 at the current location and at neighbors */

      c1 = IJKth(udata, 1, jx, jy);
      c2 = IJKth(udata, 2, jx, jy);

      v1 = IJKth(vdata, 1, jx, jy);
      v2 = IJKth(vdata, 2, jx, jy);

      v1dn = IJKth(vdata, 1, jx, jy + idn);
      v2dn = IJKth(vdata, 2, jx, jy + idn);
      v1up = IJKth(vdata, 1, jx, jy + iup);
      v2up = IJKth(vdata, 2, jx, jy + iup);

      ileft  = (jx == 0) ? 1 : -1;
      iright = (jx == MX - 1) ? -1 : 1;

      v1lt = IJKth(vdata, 1, jx + ileft, jy);
      v2lt = IJKth(vdata, 2, jx + ileft, jy);
      v1rt = IJKth(vdata, 1, jx + iright, jy);
      v2rt = IJKth(vdata, 2, jx + iright, jy);

      /* Set kinetic rate terms. */

      /*
	 rkin1 = -Q1*C3 * c1 - Q2 * c1*c2 + q4coef * c2  + TWO*C3*q3;
         rkin2 =  Q1*C3 * c1 - Q2 * c1*c2 - q4coef * c2;
      */

      Jv1 += -(Q1 * C3 + Q2 * c2) * v1 + (q4coef - Q2 * c1) * v2;
      Jv2 += (Q1 * C3 - Q2 * c2) * v1 - (q4coef + Q2 * c1) * v2;

      /* Set vertical diffusion terms. */

      /*
	 vertd1 = -(cyup+cydn) * c1 + cyup * c1up + cydn * c1dn;
	 vertd2 = -(cyup+cydn) * c2 + cyup * c2up + cydn * c2dn;
      */

      Jv1 += -(cyup + cydn) * v1 + cyup * v1up + cydn * v1dn;
      Jv2 += -(cyup + cydn) * v2 + cyup * v2up + cydn * v2dn;

      /* Set horizontal diffusion and advection terms. */

      /*
	 hord1 = hordco*(c1rt - TWO*c1 + c1lt);
	 hord2 = hordco*(c2rt - TWO*c2 + c2lt);
      */

      Jv1 += hordco * (v1rt - TWO * v1 + v1lt);
      Jv2 += hordco * (v2rt - TWO * v2 + v2lt);

      /*
	 horad1 = horaco*(c1rt - c1lt);
	 horad2 = horaco*(c2rt - c2lt);
      */

      Jv1 += horaco * (v1rt - v1lt);
      Jv2 += horaco * (v2rt - v2lt);

      /* Load two components of J*v */

      /*
	 IJKth(dudata, 1, jx, jy) = vertd1 + hord1 + horad1 + rkin1;
	 IJKth(dudata, 2, jx, jy) = vertd2 + hord2 + horad2 + rkin2;
      */

      IJKth(Jvdata, 1, jx, jy) = Jv1;
      IJKth(Jvdata, 2, jx, jy) = Jv2;
    }
  }

  return (0);
}